

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void __thiscall
notch::core::FullyConnectedLayer::FullyConnectedLayer
          (FullyConnectedLayer *this,Array *weights,Array *bias,Activation *af)

{
  ulong uVar1;
  valarray<float> *pvVar2;
  
  (this->super_ABackpropLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ABackpropLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ABackpropLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ABackpropLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ABackpropLayer)._vptr_ABackpropLayer = (_func_int **)&PTR_tag_abi_cxx11__001b13f0;
  uVar1 = bias->_M_size;
  this->nInputs = weights->_M_size / uVar1;
  this->nOutputs = uVar1;
  pvVar2 = (valarray<float> *)operator_new(0x10);
  std::valarray<float>::valarray(pvVar2,weights);
  ::std::__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::valarray<float>,void>
            ((__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2> *)&this->weights,pvVar2)
  ;
  pvVar2 = (valarray<float> *)operator_new(0x10);
  std::valarray<float>::valarray(pvVar2,bias);
  ::std::__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::valarray<float>,void>
            ((__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2> *)&this->bias,pvVar2);
  this->activationFunction = af;
  std::valarray<float>::valarray(&this->inducedLocalField,this->nOutputs);
  std::valarray<float>::valarray(&this->activationGrad,this->nOutputs);
  std::valarray<float>::valarray(&this->localGrad,this->nOutputs);
  pvVar2 = (valarray<float> *)operator_new(0x10);
  std::valarray<float>::valarray(pvVar2,this->nOutputs * this->nInputs);
  ::std::__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::valarray<float>,void>
            ((__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2> *)
             &this->weightSensitivity,pvVar2);
  pvVar2 = (valarray<float> *)operator_new(0x10);
  std::valarray<float>::valarray(pvVar2,this->nOutputs);
  ::std::__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::valarray<float>,void>
            ((__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2> *)&this->biasSensitivity
             ,pvVar2);
  std::valarray<float>::valarray(&this->propagatedErrors,this->nInputs);
  (this->policy).super___shared_ptr<notch::core::ALearningPolicy,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->policy).super___shared_ptr<notch::core::ALearningPolicy,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

FullyConnectedLayer(Array &&weights, Array &&bias,
                        const Activation &af)
        : nInputs(weights.size()/bias.size()), nOutputs(bias.size()),
          weights(new Array(weights)), bias(new Array(bias)),
          activationFunction(&af), inducedLocalField(nOutputs),
          activationGrad(nOutputs), localGrad(nOutputs),
          weightSensitivity(new Array(nInputs * nOutputs)),
          biasSensitivity(new Array(nOutputs)),
          propagatedErrors(nInputs) {}